

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O3

double __thiscall
NJamSpell::TLangModel::GetGram3Prob(TLangModel *this,TWordId word1,TWordId word2,TWordId word3)

{
  TCount TVar1;
  pair<unsigned_int,_unsigned_int> key;
  double dVar2;
  
  dVar2 = 0.0;
  if (this->UnknownWordId != word2 && this->UnknownWordId != word1) {
    key.second = word2;
    key.first = word1;
    TVar1 = GetGramHashCount<std::pair<unsigned_int,unsigned_int>>
                      (key,&this->PerfectHash,&this->Buckets);
    dVar2 = (double)TVar1;
  }
  TVar1 = GetGram3HashCount(this,word1,word2,word3);
  return ((double)(~-(ulong)(dVar2 < (double)TVar1) & (ulong)(double)TVar1) + this->K) /
         ((double)this->TotalWords + dVar2);
}

Assistant:

double TLangModel::GetGram3Prob(TWordId word1, TWordId word2, TWordId word3) const {
    double countsGram2 = GetGram2HashCount(word1, word2);
    double countsGram3 = GetGram3HashCount(word1, word2, word3);
    if (countsGram3 > countsGram2) { // hash collision
        countsGram3 = 0;
    }
    countsGram2 += TotalWords;
    countsGram3 += K;
    return countsGram3 / countsGram2;
}